

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_negx_8_aw(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_8_fc((int)(short)uVar1,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.x_flag = ((int)(m68ki_cpu.x_flag << 0x17) >> 0x1f) - uVar2;
  m68ki_cpu.v_flag = uVar2 & m68ki_cpu.x_flag;
  m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,m68ki_cpu.x_flag & 0xff);
  return;
}

Assistant:

static void m68k_op_negx_8_aw(void)
{
	uint ea = EA_AW_8();
	uint src = m68ki_read_8(ea);
	uint res = 0 - src - XFLAG_AS_1();

	FLAG_N = NFLAG_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = src & res;

	res = MASK_OUT_ABOVE_8(res);
	FLAG_Z |= res;

	m68ki_write_8(ea, res);
}